

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void remove_expired(CookieInfo *cookies)

{
  Cookie *pCVar1;
  time_t tVar2;
  Cookie *local_38;
  Cookie *pv;
  uint i;
  curl_off_t now;
  Cookie *nx;
  Cookie *co;
  CookieInfo *cookies_local;
  
  tVar2 = time((time_t *)0x0);
  if ((cookies->next_expiration <= tVar2) || (cookies->next_expiration == 0x7fffffffffffffff)) {
    cookies->next_expiration = 0x7fffffffffffffff;
    for (pv._4_4_ = 0; pv._4_4_ < 0x3f; pv._4_4_ = pv._4_4_ + 1) {
      local_38 = (Cookie *)0x0;
      nx = cookies->cookies[pv._4_4_];
      while (nx != (Cookie *)0x0) {
        pCVar1 = nx->next;
        if ((nx->expires == 0) || (tVar2 <= nx->expires)) {
          if ((nx->expires != 0) && (nx->expires < cookies->next_expiration)) {
            cookies->next_expiration = nx->expires;
          }
          local_38 = nx;
          nx = pCVar1;
        }
        else {
          if (local_38 == (Cookie *)0x0) {
            cookies->cookies[pv._4_4_] = nx->next;
          }
          else {
            local_38->next = nx->next;
          }
          cookies->numcookies = cookies->numcookies + -1;
          freecookie(nx);
          nx = pCVar1;
        }
      }
    }
  }
  return;
}

Assistant:

static void remove_expired(struct CookieInfo *cookies)
{
  struct Cookie *co, *nx;
  curl_off_t now = (curl_off_t)time(NULL);
  unsigned int i;

  /*
   * If the earliest expiration timestamp in the jar is in the future we can
   * skip scanning the whole jar and instead exit early as there will not be
   * any cookies to evict. If we need to evict however, reset the
   * next_expiration counter in order to track the next one. In case the
   * recorded first expiration is the max offset, then perform the safe
   * fallback of checking all cookies.
   */
  if(now < cookies->next_expiration &&
      cookies->next_expiration != CURL_OFF_T_MAX)
    return;
  else
    cookies->next_expiration = CURL_OFF_T_MAX;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    struct Cookie *pv = NULL;
    co = cookies->cookies[i];
    while(co) {
      nx = co->next;
      if(co->expires && co->expires < now) {
        if(!pv) {
          cookies->cookies[i] = co->next;
        }
        else {
          pv->next = co->next;
        }
        cookies->numcookies--;
        freecookie(co);
      }
      else {
        /*
         * If this cookie has an expiration timestamp earlier than what we have
         * seen so far then record it for the next round of expirations.
         */
        if(co->expires && co->expires < cookies->next_expiration)
          cookies->next_expiration = co->expires;
        pv = co;
      }
      co = nx;
    }
  }
}